

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImgList<unsigned_char> * __thiscall
cimg_library::CImgList<unsigned_char>::insert
          (CImgList<unsigned_char> *this,CImg<unsigned_char> *img,uint pos,bool is_shared)

{
  uint uVar1;
  CImg<unsigned_char> *pCVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  CImgArgumentException *this_00;
  char *pcVar5;
  ulong uVar6;
  ulong uVar7;
  ulong *puVar8;
  uchar *puVar9;
  CImg<unsigned_char> *this_01;
  ulong uVar10;
  CImg<unsigned_char> *local_f8;
  CImg<unsigned_char> *local_e0;
  uint local_bc;
  uint local_94;
  CImg<unsigned_char> *new_data;
  uint npos;
  bool is_shared_local;
  uint pos_local;
  CImg<unsigned_char> *img_local;
  CImgList<unsigned_char> *this_local;
  
  local_94 = pos;
  if (pos == 0xffffffff) {
    local_94 = this->_width;
  }
  if (this->_width < local_94) {
    this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x4008);
    uVar4 = this->_width;
    uVar1 = this->_allocated_width;
    pCVar2 = this->_data;
    pcVar5 = pixel_type();
    CImgArgumentException::CImgArgumentException
              (this_00,
               "[instance(%u,%u,%p)] CImgList<%s>::insert(): Invalid insertion request of specified image (%u,%u,%u,%u,%p) at position %u."
               ,(ulong)uVar4,(ulong)uVar1,pCVar2,pcVar5,img->_width,img->_height,img->_depth,
               img->_spectrum,img->_data,local_94);
    __cxa_throw(this_00,&CImgArgumentException::typeinfo,
                CImgArgumentException::~CImgArgumentException);
  }
  uVar4 = this->_width + 1;
  this->_width = uVar4;
  if (this->_allocated_width < uVar4) {
    if (this->_allocated_width == 0) {
      this->_allocated_width = 0x10;
      local_bc = 0x10;
    }
    else {
      local_bc = this->_allocated_width << 1;
      this->_allocated_width = local_bc;
    }
    uVar6 = CONCAT44(0,local_bc);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar6;
    uVar7 = SUB168(auVar3 * ZEXT816(0x20),0);
    uVar10 = uVar7 + 8;
    if (SUB168(auVar3 * ZEXT816(0x20),8) != 0 || 0xfffffffffffffff7 < uVar7) {
      uVar10 = 0xffffffffffffffff;
    }
    puVar8 = (ulong *)operator_new__(uVar10);
    *puVar8 = uVar6;
    local_f8 = (CImg<unsigned_char> *)(puVar8 + 1);
    if (uVar6 != 0) {
      local_e0 = local_f8;
      do {
        CImg<unsigned_char>::CImg(local_e0);
        local_e0 = local_e0 + 1;
      } while (local_e0 != local_f8 + uVar6);
    }
  }
  else {
    local_f8 = (CImg<unsigned_char> *)0x0;
  }
  if (this->_data == (CImg<unsigned_char> *)0x0) {
    this->_data = local_f8;
    if ((is_shared) &&
       (puVar9 = cimg_library::CImg::operator_cast_to_unsigned_char_((CImg *)img),
       puVar9 != (uchar *)0x0)) {
      this->_data->_width = img->_width;
      this->_data->_height = img->_height;
      this->_data->_depth = img->_depth;
      this->_data->_spectrum = img->_spectrum;
      this->_data->_is_shared = true;
      this->_data->_data = img->_data;
    }
    else {
      CImg<unsigned_char>::operator=(this->_data,img);
    }
  }
  else if (local_f8 == (CImg<unsigned_char> *)0x0) {
    if (local_94 != this->_width - 1) {
      memmove(this->_data + (ulong)local_94 + 1,this->_data + local_94,
              (ulong)((this->_width - 1) - local_94) << 5);
    }
    if ((is_shared) &&
       (puVar9 = cimg_library::CImg::operator_cast_to_unsigned_char_((CImg *)img),
       puVar9 != (uchar *)0x0)) {
      this->_data[local_94]._width = img->_width;
      this->_data[local_94]._height = img->_height;
      this->_data[local_94]._depth = img->_depth;
      this->_data[local_94]._spectrum = img->_spectrum;
      this->_data[local_94]._is_shared = true;
      this->_data[local_94]._data = img->_data;
    }
    else {
      this->_data[local_94]._spectrum = 0;
      this->_data[local_94]._depth = 0;
      this->_data[local_94]._height = 0;
      this->_data[local_94]._width = 0;
      this->_data[local_94]._data = (uchar *)0x0;
      CImg<unsigned_char>::operator=(this->_data + local_94,img);
    }
  }
  else {
    if (local_94 != 0) {
      memcpy(local_f8,this->_data,(ulong)local_94 << 5);
    }
    if (local_94 != this->_width - 1) {
      memcpy(local_f8 + (ulong)local_94 + 1,this->_data + local_94,
             (ulong)((this->_width - 1) - local_94) << 5);
    }
    if ((is_shared) &&
       (puVar9 = cimg_library::CImg::operator_cast_to_unsigned_char_((CImg *)img),
       puVar9 != (uchar *)0x0)) {
      local_f8[local_94]._width = img->_width;
      local_f8[local_94]._height = img->_height;
      local_f8[local_94]._depth = img->_depth;
      local_f8[local_94]._spectrum = img->_spectrum;
      local_f8[local_94]._is_shared = true;
      local_f8[local_94]._data = img->_data;
    }
    else {
      local_f8[local_94]._spectrum = 0;
      local_f8[local_94]._depth = 0;
      local_f8[local_94]._height = 0;
      local_f8[local_94]._width = 0;
      local_f8[local_94]._data = (uchar *)0x0;
      CImg<unsigned_char>::operator=(local_f8 + local_94,img);
    }
    memset(this->_data,0,(ulong)(this->_width - 1) << 5);
    pCVar2 = this->_data;
    if (pCVar2 != (CImg<unsigned_char> *)0x0) {
      this_01 = pCVar2 + (long)pCVar2[-1]._data;
      while (pCVar2 != this_01) {
        this_01 = this_01 + -1;
        CImg<unsigned_char>::~CImg(this_01);
      }
      operator_delete__(&pCVar2[-1]._data);
    }
    this->_data = local_f8;
  }
  return this;
}

Assistant:

CImgList<T>& insert(const CImg<T>& img, const unsigned int pos=~0U, const bool is_shared=false) {
      const unsigned int npos = pos==~0U?_width:pos;
      if (npos>_width)
        throw CImgArgumentException(_cimglist_instance
                                    "insert(): Invalid insertion request of specified image (%u,%u,%u,%u,%p) at position %u.",
                                    cimglist_instance,
                                    img._width,img._height,img._depth,img._spectrum,img._data,npos);
      CImg<T> *const new_data = (++_width>_allocated_width)?new CImg<T>[_allocated_width?(_allocated_width<<=1):(_allocated_width=16)]:0;
      if (!_data) { // Insert new element into empty list.
        _data = new_data;
        if (is_shared && img) {
          _data->_width = img._width; _data->_height = img._height; _data->_depth = img._depth; _data->_spectrum = img._spectrum;
          _data->_is_shared = true; _data->_data = img._data;
        } else *_data = img;
      }
      else {
        if (new_data) { // Insert with re-allocation.
          if (npos) std::memcpy(new_data,_data,sizeof(CImg<T>)*npos);
          if (npos!=_width-1) std::memcpy(new_data+npos+1,_data+npos,sizeof(CImg<T>)*(_width-1-npos));
          if (is_shared && img) {
            new_data[npos]._width = img._width; new_data[npos]._height = img._height; new_data[npos]._depth = img._depth;
            new_data[npos]._spectrum = img._spectrum; new_data[npos]._is_shared = true; new_data[npos]._data = img._data;
          } else {
            new_data[npos]._width = new_data[npos]._height = new_data[npos]._depth = new_data[npos]._spectrum = 0; new_data[npos]._data = 0;
            new_data[npos] = img;
          }
          std::memset(_data,0,sizeof(CImg<T>)*(_width-1));
          delete[] _data;
          _data = new_data;
        } else { // Insert without re-allocation.
          if (npos!=_width-1) std::memmove(_data+npos+1,_data+npos,sizeof(CImg<T>)*(_width-1-npos));
          if (is_shared && img) {
            _data[npos]._width = img._width; _data[npos]._height = img._height; _data[npos]._depth = img._depth; _data[npos]._spectrum = img._spectrum;
            _data[npos]._is_shared = true; _data[npos]._data = img._data;
          } else {
            _data[npos]._width = _data[npos]._height = _data[npos]._depth = _data[npos]._spectrum = 0; _data[npos]._data = 0;
            _data[npos] = img;
          }
        }
      }
      return *this;
    }